

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

sexp sexp_mul(sexp ctx,sexp a,sexp b)

{
  undefined1 *puVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  ulong uVar4;
  sexp psVar5;
  sexp ctx_00;
  undefined8 in_RDX;
  undefined8 in_RSI;
  sexp in_RDI;
  sexp in_stack_00000020;
  sexp in_stack_00000028;
  sexp in_stack_00000030;
  sexp in_stack_00000038;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp tmp;
  sexp r;
  int t;
  int bt;
  int at;
  sexp_lsint_t prod;
  sexp in_stack_ffffffffffffff58;
  sexp in_stack_ffffffffffffff60;
  double f;
  sexp in_stack_ffffffffffffff68;
  sexp in_stack_ffffffffffffff70;
  sexp in_stack_ffffffffffffff78;
  sexp in_stack_ffffffffffffff80;
  sexp in_stack_ffffffffffffff98;
  sexp ctx_01;
  sexp_uint_t b_00;
  undefined8 uVar6;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 uVar7;
  undefined8 a_00;
  
  uVar2 = sexp_number_type((sexp)in_RSI);
  uVar3 = sexp_number_type((sexp)in_RDX);
  uVar6 = &DAT_0000043e;
  b_00 = 0x43e;
  memset(&stack0xffffffffffffffa8,0,0x10);
  psVar5 = (sexp)&stack0xffffffffffffffb8;
  ctx_01 = (sexp)(in_RDI->value).context.saves;
  (in_RDI->value).context.saves = (sexp_gc_var_t *)&stack0xffffffffffffffa8;
  uVar7 = uVar3;
  a_00 = in_RDX;
  if ((int)uVar3 < (int)uVar2) {
    uVar6 = in_RSI;
    in_stack_ffffffffffffffcc = uVar2;
    uVar7 = uVar2;
    uVar2 = uVar3;
    a_00 = in_RSI;
    in_RSI = in_RDX;
  }
  ctx_00 = (sexp)(ulong)(uint)(uVar7 + uVar2 * 6);
  switch(ctx_00) {
  case (sexp)0x0:
  case (sexp)0x1:
  case (sexp)0x2:
  case (sexp)0x3:
  case (sexp)0x4:
    uVar6 = sexp_type_exception(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                                (sexp_uint_t)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    break;
  case (sexp)0x7:
    uVar4 = ((long)in_RSI >> 1) * ((long)a_00 >> 1);
    uVar6 = SUB168(SEXT816((long)in_RSI >> 1) * SEXT816((long)a_00 >> 1),8);
    puVar1 = (undefined1 *)((long)&((sexp)uVar6)->tag + 1);
    if (((SBORROW8(uVar6,-1) != SBORROW8((long)puVar1,(ulong)(uVar4 < 0xc000000000000000))) ==
         (long)((long)puVar1 - (ulong)(uVar4 < 0xc000000000000000)) < 0) &&
       ((long)uVar6 < (long)(ulong)(uVar4 < 0x4000000000000000))) {
      uVar6 = uVar4 * 2 | 1;
    }
    else {
      sexp_fixnum_to_bignum(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      uVar6 = sexp_mul((sexp)in_RSI,(sexp)a_00,(sexp)uVar6);
    }
    break;
  case (sexp)0x8:
    if ((sexp)in_RSI == (sexp)&DAT_00000001) {
      uVar6 = &DAT_00000001;
    }
    else {
      uVar6 = sexp_make_flonum(in_stack_ffffffffffffff68,(double)in_stack_ffffffffffffff60);
    }
    break;
  case (sexp)0x9:
    psVar5 = sexp_bignum_fxmul((sexp)CONCAT44(uVar2,uVar7),
                               (sexp)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                               (sexp)uVar6,b_00,(int)((ulong)ctx_01 >> 0x20));
    (psVar5->value).flonum_bits[0] =
         ((byte)((long)in_RSI >> 0x3f) | 1) * (((sexp)a_00)->value).flonum_bits[0];
    uVar6 = sexp_bignum_normalize(in_stack_ffffffffffffff58);
    break;
  case (sexp)0xa:
  case (sexp)0x16:
    sexp_make_ratio(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  case (sexp)0x1c:
    uVar6 = sexp_ratio_mul(ctx_01,psVar5,ctx_00);
    break;
  case (sexp)0xb:
  case (sexp)0x11:
  case (sexp)0x17:
  case (sexp)0x1d:
    sexp_make_complex(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60)
    ;
  case (sexp)0x23:
    uVar6 = sexp_complex_mul(ctx_01,psVar5,ctx_00);
    break;
  case (sexp)0xe:
    uVar6 = sexp_make_flonum(in_stack_ffffffffffffff68,(double)in_stack_ffffffffffffff60);
    break;
  case (sexp)0xf:
    psVar5 = in_RDI;
    sexp_bignum_to_double((((sexp)in_RSI)->value).type.name);
    uVar6 = sexp_make_flonum(psVar5,(double)in_stack_ffffffffffffff60);
    break;
  case (sexp)0x10:
    f = (((sexp)in_RSI)->value).flonum;
    sexp_ratio_to_double(ctx_00,in_stack_ffffffffffffff98);
    uVar6 = sexp_make_flonum(in_stack_ffffffffffffff68,f);
    break;
  case (sexp)0x15:
    sexp_bignum_mul(in_stack_00000038,in_stack_00000030,in_stack_00000028,in_stack_00000020);
    uVar6 = sexp_bignum_normalize(in_stack_ffffffffffffff58);
  }
  (in_RDI->value).context.saves = (sexp_gc_var_t *)ctx_01;
  return (sexp)uVar6;
}

Assistant:

sexp sexp_mul (sexp ctx, sexp a, sexp b) {
  sexp_lsint_t prod;
  int at=sexp_number_type(a), bt=sexp_number_type(b), t;
  sexp r=SEXP_VOID;
  sexp_gc_var1(tmp);
  sexp_gc_preserve1(ctx, tmp);
  if (at > bt) {r=a; a=b; b=r; t=at; at=bt; bt=t;}
  switch ((at * SEXP_NUM_NUMBER_TYPES) + bt) {
  case SEXP_NUM_NOT_NOT: case SEXP_NUM_NOT_FIX:
  case SEXP_NUM_NOT_FLO: case SEXP_NUM_NOT_BIG:
#if SEXP_USE_RATIOS
  case SEXP_NUM_NOT_RAT:
#endif
    r = sexp_type_exception(ctx, NULL, SEXP_NUMBER, a);
    break;
  case SEXP_NUM_FIX_FIX:
    prod = lsint_mul_sint(lsint_from_sint(sexp_unbox_fixnum(a)), sexp_unbox_fixnum(b));
    if (!lsint_is_fixnum(prod))
      r = sexp_mul(ctx, tmp=sexp_fixnum_to_bignum(ctx, a), b);
    else
      r = sexp_make_fixnum(lsint_to_sint(prod));
    break;
  case SEXP_NUM_FIX_FLO:
    r = (a==SEXP_ZERO ? a : sexp_make_flonum(ctx, sexp_fixnum_to_double(a)*sexp_flonum_value(b)));
    break;
  case SEXP_NUM_FIX_BIG:
    r = sexp_bignum_fxmul(ctx, NULL, b, sexp_unbox_fx_abs(a), 0);
    sexp_bignum_sign(r) = sexp_fx_sign(a) * sexp_bignum_sign(b);
    r = sexp_bignum_normalize(r);
    break;
  case SEXP_NUM_FLO_FLO:
    r = sexp_fp_mul(ctx, a, b);
    break;
  case SEXP_NUM_FLO_BIG:
    r = sexp_make_flonum(ctx, sexp_flonum_value(a) * sexp_bignum_to_double(b));
    break;
  case SEXP_NUM_BIG_BIG:
    r = sexp_bignum_normalize(sexp_bignum_mul(ctx, NULL, a, b));
    break;
#if SEXP_USE_RATIOS
  case SEXP_NUM_FLO_RAT:
    r = sexp_make_flonum(ctx, sexp_flonum_value(a) * sexp_ratio_to_double(ctx, b));
    break;
  case SEXP_NUM_FIX_RAT:
  case SEXP_NUM_BIG_RAT:
    a = tmp = sexp_make_ratio(ctx, a, SEXP_ONE);
    /* ... FALLTHROUGH ... */
  case SEXP_NUM_RAT_RAT:
    r = sexp_ratio_mul(ctx, a, b);
    break;
#endif
#if SEXP_USE_COMPLEX
#if SEXP_USE_RATIOS
  case SEXP_NUM_RAT_CPX:
#endif
  case SEXP_NUM_FLO_CPX:
  case SEXP_NUM_FIX_CPX:
  case SEXP_NUM_BIG_CPX:
    a = tmp = sexp_make_complex(ctx, a, SEXP_ZERO);
    /* ... FALLTHROUGH ... */
  case SEXP_NUM_CPX_CPX:
    r = sexp_complex_mul(ctx, a, b);
    break;
#endif
  }
  sexp_gc_release1(ctx);
  return r;
}